

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O2

void ZSTD_ldm_adjustParameters(ldmParams_t *params,ZSTD_compressionParameters *cParams)

{
  U32 UVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = cParams->windowLog;
  params->windowLog = uVar2;
  if (params->minMatchLength == 0) {
    params->minMatchLength = 0x40;
  }
  uVar3 = params->hashLog;
  if (uVar3 == 0) {
    uVar3 = 6;
    if (6 < uVar2 - 7) {
      uVar3 = uVar2 - 7;
    }
    params->hashLog = uVar3;
  }
  if (params->hashRateLog == 0) {
    UVar1 = uVar2 - uVar3;
    if (uVar2 < uVar3) {
      UVar1 = 0;
    }
    params->hashRateLog = UVar1;
  }
  uVar2 = 3;
  if (params->bucketSizeLog != 0) {
    uVar2 = params->bucketSizeLog;
  }
  if (uVar3 <= uVar2) {
    uVar2 = uVar3;
  }
  params->bucketSizeLog = uVar2;
  return;
}

Assistant:

void ZSTD_ldm_adjustParameters(ldmParams_t* params,
                               ZSTD_compressionParameters const* cParams)
{
    params->windowLog = cParams->windowLog;
    ZSTD_STATIC_ASSERT(LDM_BUCKET_SIZE_LOG <= ZSTD_LDM_BUCKETSIZELOG_MAX);
    DEBUGLOG(4, "ZSTD_ldm_adjustParameters");
    if (!params->bucketSizeLog) params->bucketSizeLog = LDM_BUCKET_SIZE_LOG;
    if (!params->minMatchLength) params->minMatchLength = LDM_MIN_MATCH_LENGTH;
    if (params->hashLog == 0) {
        params->hashLog = MAX(ZSTD_HASHLOG_MIN, params->windowLog - LDM_HASH_RLOG);
        assert(params->hashLog <= ZSTD_HASHLOG_MAX);
    }
    if (params->hashRateLog == 0) {
        params->hashRateLog = params->windowLog < params->hashLog
                                   ? 0
                                   : params->windowLog - params->hashLog;
    }
    params->bucketSizeLog = MIN(params->bucketSizeLog, params->hashLog);
}